

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_direct.c
# Opt level: O2

realtype ** newDenseMat(sunindextype m,sunindextype n)

{
  realtype **__ptr;
  realtype *prVar1;
  long lVar2;
  
  if ((0 < m && 0 < n) && (__ptr = (realtype **)malloc(n * 8), __ptr != (realtype **)0x0)) {
    prVar1 = (realtype *)malloc(m * n * 8);
    *__ptr = prVar1;
    if (prVar1 != (realtype *)0x0) {
      for (lVar2 = 1; prVar1 = prVar1 + m, n != lVar2; lVar2 = lVar2 + 1) {
        __ptr[lVar2] = prVar1;
      }
      return __ptr;
    }
    free(__ptr);
  }
  return (realtype **)0x0;
}

Assistant:

realtype **newDenseMat(sunindextype m, sunindextype n)
{
  sunindextype j;
  realtype **a;

  if ( (n <= 0) || (m <= 0) ) return(NULL);

  a = NULL;
  a = (realtype **) malloc(n * sizeof(realtype *));
  if (a == NULL) return(NULL);

  a[0] = NULL;
  a[0] = (realtype *) malloc(m * n * sizeof(realtype));
  if (a[0] == NULL) {
    free(a); a = NULL;
    return(NULL);
  }

  for (j=1; j < n; j++) a[j] = a[0] + j * m;

  return(a);
}